

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O1

void GameDraw(void)

{
  double dVar1;
  ALLEGRO_FONT *pAVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  float fVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ALLEGRO_BITMAP *pAVar13;
  ulong uVar14;
  double *pdVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined8 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  double dVar24;
  double in_XMM3_Qa;
  double dVar25;
  double dVar26;
  ALLEGRO_VERTEX Points [4];
  ALLEGRO_TRANSFORM transform;
  double dStack_140;
  undefined4 local_108;
  float local_104;
  undefined4 local_100;
  float local_fc;
  float local_f8;
  undefined8 local_f4;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  float local_e4;
  float local_e0;
  undefined4 local_dc;
  float local_d8;
  float local_d4;
  undefined8 local_d0;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  float local_c0;
  float local_bc;
  undefined4 local_b8;
  float local_b4;
  float local_b0;
  undefined8 local_ac;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 local_9c;
  float local_98;
  undefined4 local_94;
  float local_90;
  float local_8c;
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_70 [64];
  
  al_identity_transform(local_70);
  al_scale_transform((float)screen_height / 480.0,(float)screen_height / 480.0,local_70);
  al_use_transform(local_70);
  fVar8 = ((float)screen_width * 480.0) / (float)screen_height;
  uVar14 = 0x77f;
  dVar26 = 480.0;
  do {
    lVar12 = (long)(int)((ScrollPos[1] + -240.0) * 4096.0) * (long)TanTable[uVar14];
    if (lVar12 < 0x7fffffff0001) {
      if (lVar12 < -0x7fffffff0000) {
        al_set_errno(0x22);
        dVar1 = -32768.0;
      }
      else {
        dVar1 = (double)(int)((ulong)lVar12 >> 0x10) * 1.52587890625e-05;
      }
    }
    else {
      al_set_errno(0x22);
      dVar1 = 32767.99998474121;
    }
    dVar24 = dVar26;
    if ((-261.0 < dVar1) && (dVar1 < -5.0)) {
      dVar4 = ((double)((int)(dVar1 * 65536.0) & 0xffffff) * 1.52587890625e-05 + -1.0) *
              3.141592653589793;
      dVar25 = (double)(int)uVar14 * 0.25;
      in_XMM3_Qa = dVar25;
      dVar4 = sin((dVar4 + dVar4) * 8.0 * 0.0078125 + WaveY);
      dVar25 = (dVar4 * -125.0) / dVar1 + dVar25;
      if (dVar25 < dVar26) {
        dVar24 = ceil(dVar25);
        dVar4 = ScrollPos[0] * 0.125 + 64.0 + TexX;
        local_108 = 0;
        local_100 = 0;
        fVar16 = (float)(dVar1 * 4.0 + dVar4);
        fVar17 = (float)(dVar1 + 5.0);
        uVar20 = 0x3f800000;
        uVar22 = 0;
        local_104 = (float)dVar25;
        local_fc = fVar16;
        local_f8 = fVar17;
        uVar19 = al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
        local_dc = 0;
        fVar18 = (float)(dVar4 - dVar1 * 4.0);
        uVar21 = 0x3f800000;
        uVar23 = 0;
        uStack_ec = uVar20;
        uStack_e8 = uVar22;
        local_e4 = fVar8;
        local_e0 = (float)dVar25;
        local_d8 = fVar18;
        local_d4 = fVar17;
        local_f4 = uVar19;
        uVar19 = al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
        local_b8 = 0;
        uVar20 = 0x3f800000;
        uVar22 = 0;
        uStack_c8 = uVar21;
        uStack_c4 = uVar23;
        local_c0 = fVar8;
        local_bc = (float)dVar26;
        local_b4 = fVar18;
        local_b0 = fVar17;
        local_d0 = uVar19;
        uVar19 = al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
        local_9c = 0;
        local_94 = 0;
        uVar21 = 0x3f800000;
        uVar23 = 0;
        uStack_a4 = uVar20;
        uStack_a0 = uVar22;
        local_98 = (float)dVar26;
        local_90 = fVar16;
        local_8c = fVar17;
        local_ac = uVar19;
        uVar19 = al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
        uStack_80 = uVar21;
        uStack_7c = uVar23;
        local_88 = uVar19;
        al_draw_prim(&local_108,0,water,0,4,5);
      }
    }
    bVar3 = 0x3d0 < uVar14;
    uVar14 = uVar14 - 1;
    dVar26 = dVar24;
  } while (bVar3);
  al_set_clipping_rectangle(0,0,screen_width,(int)((dVar24 * (double)screen_height) / 480.0 + 1.0));
  al_clear_to_color((int)cloud_color_0,(int)cloud_color_1);
  lVar12 = 0xe;
  pdVar15 = &Clouds[7].y;
  do {
    dVar24 = ((anon_struct_16_2_947320ea *)(pdVar15 + -1))->x + CloudX;
    dVar4 = sin(dVar24);
    iVar9 = al_get_bitmap_width(cloud);
    dVar26 = sin(dVar24);
    dVar7 = dVar26 * 1.4 + (double)iVar9 + dVar24;
    dVar26 = *pdVar15;
    dVar25 = cos(dVar24);
    dVar1 = *pdVar15;
    iVar9 = al_get_bitmap_height(cloud);
    dVar5 = cos(dVar24);
    pAVar13 = cloud;
    uVar20 = (undefined4)((ulong)in_XMM3_Qa >> 0x20);
    if (0.0 <= dVar7) {
      dVar1 = dVar5 * 1.4 + dVar1 + (double)iVar9;
      dVar26 = -dVar25 * 1.4 + dVar26;
      auVar6._8_4_ = SUB84(dVar26,0);
      auVar6._0_8_ = dVar1;
      auVar6._12_4_ = (int)((ulong)dVar26 >> 0x20);
      dVar24 = dVar24 - dVar4 * 1.4;
      iVar9 = al_get_bitmap_width(cloud);
      iVar10 = al_get_bitmap_height(cloud);
      in_XMM3_Qa = (double)CONCAT44(uVar20,(float)iVar10);
      dStack_140 = auVar6._8_8_;
      al_draw_scaled_bitmap
                (0,0,(float)iVar9,in_XMM3_Qa,(float)dVar24,(float)dStack_140,(float)(dVar7 - dVar24)
                 ,(float)(dVar1 - dStack_140),pAVar13,0);
    }
    else {
      dVar26 = *(double *)((long)&Clouds[0].x + (ulong)(((uint)lVar12 & 7) << 4));
      iVar9 = al_get_bitmap_width(cloud);
      iVar10 = rand();
      ((anon_struct_16_2_947320ea *)(pdVar15 + -1))->x =
           ((double)iVar10 * 32.0) / 2147483647.0 + (double)iVar9 + dVar26 + 8.0;
      iVar9 = rand();
      *pdVar15 = ((double)screen_height * (double)iVar9 * 0.5) / 2147483647.0;
    }
    lVar12 = lVar12 + -1;
    pdVar15 = pdVar15 + -2;
  } while (lVar12 != 6);
  al_set_clipping_rectangle(0,0,screen_width,screen_height);
  DrawLevelBackground(Lvl,ScrollPos);
  pAVar13 = GetCurrentBitmap(PlayerAnim);
  iVar9 = al_get_bitmap_width(pAVar13);
  iVar10 = al_get_bitmap_height(pAVar13);
  fVar16 = (float)iVar10 * 0.5;
  dVar26 = (PlayerPos[1] - ScrollPos[1]) + 240.0;
  al_draw_scaled_rotated_bitmap
            ((float)iVar9 * 0.5,fVar16,
             (float)((double)(fVar8 * 0.5) + (PlayerPos[0] - ScrollPos[0])),
             CONCAT44((int)((ulong)dVar26 >> 0x20),(float)dVar26),0x3f800000,0x3f800000,
             (float)PlayerPos[2],pAVar13,(uint)KeyFlags >> 5 & 1);
  DrawLevelForeground(Lvl);
  al_identity_transform(local_70);
  al_use_transform(local_70);
  iVar9 = screen_width;
  pAVar2 = (ALLEGRO_FONT *)demo_data[1].dat;
  iVar10 = al_get_text_width(pAVar2,"Items Required: 1000");
  uVar20 = al_map_rgb(0xff,0xff,0xff);
  demo_textprintf(pAVar2,iVar9 - iVar10,8,0x1124c0,uVar20,(ulong)(uint)RequiredObjectsLeft);
  iVar9 = screen_width;
  pAVar2 = (ALLEGRO_FONT *)demo_data[1].dat;
  iVar10 = al_get_text_width(pAVar2,"Items Remaining: 1000");
  iVar11 = al_get_font_line_height(demo_data[1].dat);
  uVar20 = al_map_rgb(0xff,0xff,0xff);
  demo_textprintf(pAVar2,iVar9 - iVar10,iVar11 + 8,0x1124e9,uVar20,fVar16,
                  (ulong)(uint)TotalObjectsLeft);
  return;
}

Assistant:

static void GameDraw(void)
{
   ALLEGRO_BITMAP *ch;
   double depth;
   ALLEGRO_VERTEX Points[4];
   ALLEGRO_TRANSFORM transform;
   int chw, chh;
   float w;
   
   al_identity_transform(&transform);
   al_scale_transform(&transform, screen_height / 480.0, screen_height / 480.0);
   al_use_transform(&transform);

   w = screen_width * 480.0 / screen_height;

   /* draw background */
   {
      int c = 480 * 4 - 1;
      double y2, lowy = 480, y1, u;
      double index;

      while (c > 480 * 2 + 15) {

         depth = al_fixtof(al_fixmul(TanTable[c], (int)((ScrollPos[1] - 240) * 4096.0f)));

         if (depth > -261 && depth < -5.0f) {
            int d = ((int)(depth * 65536)) & (256 * 65536 - 1);
            y1 = lowy;
            index = (d / 65536.0 - 1.0) * ALLEGRO_PI * 2 * 8 / 128.0f;

            y2 = c / 4.0 - 125.0f * sin(index + WaveY) / depth;

            if (y2 < lowy) {
               lowy = ceil(y2);

               u = 64 + ScrollPos[0] / 8 + TexX;
               set_v(Points + 0, 0, y2, u + depth * 4, depth + 5);
               set_v(Points + 1, w, y2, u - depth * 4, depth + 5);
               set_v(Points + 2, w, y1, u - depth * 4, depth + 5);
               set_v(Points + 3, 0, y1, u + depth * 4, depth + 5);

               al_draw_prim(Points, NULL, water, 0, 4, ALLEGRO_PRIM_TRIANGLE_FAN);
            }
         }
         c--;
      }

      al_set_clipping_rectangle(0, 0, screen_width, lowy * screen_height / 480 + 1);
      al_clear_to_color(cloud_color);
      DrawClouds();
      al_set_clipping_rectangle(0, 0, screen_width, screen_height);
   }

   /* draw interactable parts of level */
   DrawLevelBackground(Lvl, ScrollPos);

#ifdef DEBUG_EDGES
   solid_mode();
   struct Edge *E = Lvl->AllEdges;

   while (E) {
      line(buffer,
           E->EndPoints[0]->Normal[0] - x + (screen_width >> 1),
           E->EndPoints[0]->Normal[1] - y + (screen_height >> 1),
           E->EndPoints[1]->Normal[0] - x + (screen_width >> 1),
           E->EndPoints[1]->Normal[1] - y + (screen_height >> 1), al_map_rgb(0, 0,
                                                                     0));
      E = E->Next;
   }
#endif

#ifdef DEBUG_OBJECTS
   struct Object *O = Lvl->AllObjects;

   while (O) {
      rect(buffer,
           O->Bounder.TL.Pos[0] - x + (screen_width >> 1),
           O->Bounder.TL.Pos[1] - y + (screen_height >> 1),
           O->Bounder.BR.Pos[0] - x + (screen_width >> 1),
           O->Bounder.BR.Pos[1] - y + (screen_height >> 1), al_map_rgb(0, 0, 0));
      circle(buffer, O->Pos[0] - x + (screen_width >> 1),
             O->Pos[1] - y + (screen_height >> 1), O->ObjType->Radius, al_map_rgb(0,
                                                                          0,
                                                                          0));
      O = O->Next;
   }
#endif

   /* add player sprite */
   ch = GetCurrentBitmap(PlayerAnim);
   chw = al_get_bitmap_width(ch);
   chh = al_get_bitmap_height(ch);

   al_draw_scaled_rotated_bitmap(ch, chw / 2.0, chh / 2.0,
      (PlayerPos[0] - ScrollPos[0]) + w / 2,
      (PlayerPos[1] - ScrollPos[1]) + 480.0 / 2,
      1, 1, PlayerPos[2],
      KeyFlags & KEYFLAG_FLIP ? ALLEGRO_FLIP_HORIZONTAL : 0);

   DrawLevelForeground(Lvl);
   
   al_identity_transform(&transform);
   al_use_transform(&transform);

   /* add status */
   demo_textprintf(demo_font,
                 screen_width - al_get_text_width(demo_font,
                                        "Items Required: 1000"), 8,
                 al_map_rgb(255, 255, 255), "Items Required: %d",
                 RequiredObjectsLeft);
   demo_textprintf(demo_font,
                 screen_width - al_get_text_width(demo_font,
                                        "Items Remaining: 1000"),
                 8 + al_get_font_line_height(demo_font), al_map_rgb(255, 255, 255),
                 "Items Remaining: %d", TotalObjectsLeft);
}